

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_1::SymbolTable::EnsureUnique(SymbolTable *this,string_view *name)

{
  const_iterator cVar1;
  bool bVar2;
  
  cVar1 = std::
          _Rb_tree<wabt::string_view,_wabt::string_view,_std::_Identity<wabt::string_view>,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
          ::find(&(this->seen_names_)._M_t,name);
  bVar2 = (_Rb_tree_header *)cVar1._M_node !=
          &(this->seen_names_)._M_t._M_impl.super__Rb_tree_header;
  if (bVar2) {
    _GLOBAL__N_1::SymbolTable::EnsureUnique((SymbolTable *)name);
  }
  else {
    std::
    _Rb_tree<wabt::string_view,wabt::string_view,std::_Identity<wabt::string_view>,std::less<wabt::string_view>,std::allocator<wabt::string_view>>
    ::_M_insert_unique<wabt::string_view_const&>
              ((_Rb_tree<wabt::string_view,wabt::string_view,std::_Identity<wabt::string_view>,std::less<wabt::string_view>,std::allocator<wabt::string_view>>
                *)&this->seen_names_,name);
  }
  return (Result)(uint)bVar2;
}

Assistant:

Result EnsureUnique(const string_view& name) {
    if (seen_names_.count(name)) {
      fprintf(stderr, "error: duplicate symbol when writing relocatable "
              "binary: %s\n", &name[0]);
      return Result::Error;
    }
    seen_names_.insert(name);
    return Result::Ok;
  }